

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::reti(GB *this)

{
  u8 uVar1;
  ulong uVar2;
  
  uVar2 = (this->s).op_tick - 6;
  switch(uVar2 << 0x3d | uVar2 >> 3) {
  case 0:
    (this->s).ime = true;
    (this->s).ime_enable = false;
    break;
  case 1:
    uVar1 = pop(this);
    (this->s).field_6.field_0.z = uVar1;
    break;
  case 2:
    uVar1 = pop(this);
    (this->s).field_6.field_0.w = uVar1;
    break;
  case 3:
    (this->s).pc = (u16)(this->s).field_6;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::reti() {
  switch (s.op_tick) {
    case 6: s.ime_enable = false; s.ime = true; break;
    case 14: s.z = pop(); break;
    case 22: s.w = pop(); break;
    case 30: s.pc = s.wz; op_done(); break;
  }
}